

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xcursor.c
# Opt level: O0

void set_Xcursor(DspInterface dsp,uint8_t *bitmap,int hotspot_x,int hotspot_y,Cursor *return_cursor,
                int from_lisp)

{
  undefined8 uVar1;
  undefined8 uVar2;
  Cursor CVar3;
  undefined4 uVar4;
  Pixmap Cursor_msk;
  Pixmap Cursor_src;
  uchar local_58 [4];
  int i;
  uchar image [32];
  int from_lisp_local;
  Cursor *return_cursor_local;
  int hotspot_y_local;
  int hotspot_x_local;
  uint8_t *bitmap_local;
  DspInterface dsp_local;
  
  if (from_lisp == 0) {
    for (Cursor_src._4_4_ = 0; (int)Cursor_src._4_4_ < 0x20; Cursor_src._4_4_ = Cursor_src._4_4_ + 1
        ) {
      local_58[(int)Cursor_src._4_4_] = ""[bitmap[(int)Cursor_src._4_4_]];
    }
  }
  else {
    for (Cursor_src._4_4_ = 0; (int)Cursor_src._4_4_ < 0x20; Cursor_src._4_4_ = Cursor_src._4_4_ + 1
        ) {
      local_58[(int)Cursor_src._4_4_] = ""[bitmap[(int)(Cursor_src._4_4_ ^ 3)]];
    }
  }
  uVar1 = XCreatePixmapFromBitmapData(dsp->display_id,dsp->DisplayWindow,local_58,0x10,0x10,1,0,1);
  uVar4 = 0;
  uVar2 = XCreatePixmapFromBitmapData(dsp->display_id,dsp->DisplayWindow,local_58,0x10,0x10,1,0,1);
  CVar3 = XCreatePixmapCursor(dsp->display_id,uVar1,uVar2,&cursor_fore_xcsd,&cursor_back_xcsd,
                              hotspot_x,CONCAT44(uVar4,hotspot_y));
  *return_cursor = CVar3;
  XFreePixmap(dsp->display_id,uVar1);
  XFreePixmap(dsp->display_id,uVar2);
  XFlush(dsp->display_id);
  return;
}

Assistant:

void set_Xcursor(DspInterface dsp, const uint8_t *bitmap, int hotspot_x, int hotspot_y, Cursor *return_cursor, int from_lisp)
{
  extern const unsigned char reversedbits[];
  unsigned char image[32];
  int i;
  Pixmap Cursor_src, Cursor_msk;

#ifdef BYTESWAP
  if (from_lisp)
    for (i = 0; i < 32; i++) image[i] = reversedbits[bitmap[i ^ 3]];
  else
    for (i = 0; i < 32; i++) image[i] = reversedbits[bitmap[i]];
#else
  for (i = 0; i < 32; i++) image[i] = reversedbits[bitmap[i]];
#endif /* BYTESWAP */

  XLOCK;
  Cursor_src = XCreatePixmapFromBitmapData(dsp->display_id, dsp->DisplayWindow, (char *)image,
					   16, 16, 1, 0, 1); /* Has to have a depth of 1! */
  Cursor_msk = XCreatePixmapFromBitmapData(dsp->display_id, dsp->DisplayWindow, (char *)image,
					   16, 16, 1, 0, 1); /* Has to have a depth of 1! */
  *return_cursor = XCreatePixmapCursor(dsp->display_id, Cursor_src, Cursor_msk, &cursor_fore_xcsd,
                                       &cursor_back_xcsd, hotspot_x, hotspot_y);

  /* Should free these now (doc says server may not copy them) */
  XFreePixmap(dsp->display_id, Cursor_src);
  XFreePixmap(dsp->display_id, Cursor_msk);

  XFlush(dsp->display_id);
  XUNLOCK(dsp);

}